

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconSys::resizeEvent(QSystemTrayIconSys *this,QResizeEvent *event)

{
  bool bVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::update((QWidget *)this);
  QWidget::resizeEvent((QWidget *)this,event);
  bVar1 = QBalloonTip::isBalloonVisible();
  if (bVar1) {
    QVar2 = globalGeometry(this);
    local_20 = (QPoint)(((long)QVar2.x2.m_i.m_i + (long)QVar2.x1.m_i.m_i) / 2 & 0xffffffffU |
                       ((QVar2._8_8_ >> 0x20) + (QVar2._0_8_ >> 0x20)) / 2 << 0x20);
    QBalloonTip::updateBalloonPosition(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconSys::resizeEvent(QResizeEvent *event)
{
    update();
    QWidget::resizeEvent(event);
    if (QBalloonTip::isBalloonVisible())
        QBalloonTip::updateBalloonPosition(globalGeometry().center());
}